

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

void nghttp2_frame_push_promise_init
               (nghttp2_push_promise *frame,uint8_t flags,int32_t stream_id,
               int32_t promised_stream_id,nghttp2_nv *nva,size_t nvlen)

{
  size_t nvlen_local;
  nghttp2_nv *nva_local;
  int32_t promised_stream_id_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  nghttp2_push_promise *frame_local;
  
  nghttp2_frame_hd_init(&frame->hd,0,'\x05',flags,stream_id);
  frame->padlen = 0;
  frame->nva = nva;
  frame->nvlen = nvlen;
  frame->promised_stream_id = promised_stream_id;
  frame->reserved = '\0';
  return;
}

Assistant:

void nghttp2_frame_push_promise_init(nghttp2_push_promise *frame, uint8_t flags,
                                     int32_t stream_id,
                                     int32_t promised_stream_id,
                                     nghttp2_nv *nva, size_t nvlen) {
  nghttp2_frame_hd_init(&frame->hd, 0, NGHTTP2_PUSH_PROMISE, flags, stream_id);
  frame->padlen = 0;
  frame->nva = nva;
  frame->nvlen = nvlen;
  frame->promised_stream_id = promised_stream_id;
  frame->reserved = 0;
}